

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

bool bssl::dtls_has_unprocessed_handshake_data(SSL *ssl)

{
  ushort uVar1;
  DTLS1_STATE *pDVar2;
  _Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter> _Var3;
  size_t idx;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  pDVar2 = ssl->d1;
  uVar1 = pDVar2->handshake_read_seq;
  uVar5 = (uint)uVar1 * 0x2493 >> 0x10;
  uVar4 = (ulong)((((uVar1 - uVar5 & 0xffff) >> 1) + uVar5 >> 2) * -7 + (uint)uVar1 & 0xffff);
  bVar7 = true;
  uVar6 = 0;
  do {
    if (((*(ushort *)&ssl->s3->field_0xdc & 8) == 0) || (uVar4 != uVar6)) {
      if ((DTLSIncomingMessage *)
          pDVar2->incoming_messages[uVar6]._M_t.
          super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> != (DTLSIncomingMessage *)0x0) {
        return bVar7;
      }
    }
    else {
      _Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl =
           pDVar2->incoming_messages[uVar4]._M_t.
           super___uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::DTLSIncomingMessage_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>;
      if ((_Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>._M_head_impl ==
           (DTLSIncomingMessage *)0x0) ||
         (*(long *)((long)_Var3.super__Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false>.
                          _M_head_impl + 0x20) != 0)) {
        __assert_fail("dtls1_is_current_message_complete(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x1d9,"bool bssl::dtls_has_unprocessed_handshake_data(const SSL *)");
      }
    }
    bVar7 = uVar6 < 6;
    uVar6 = uVar6 + 1;
    if (uVar6 == 7) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool dtls_has_unprocessed_handshake_data(const SSL *ssl) {
  size_t current = ssl->d1->handshake_read_seq % SSL_MAX_HANDSHAKE_FLIGHT;
  for (size_t i = 0; i < SSL_MAX_HANDSHAKE_FLIGHT; i++) {
    // Skip the current message.
    if (ssl->s3->has_message && i == current) {
      assert(dtls1_is_current_message_complete(ssl));
      continue;
    }
    if (ssl->d1->incoming_messages[i] != nullptr) {
      return true;
    }
  }
  return false;
}